

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3VdbeMemMove(Mem *pTo,Mem *pFrom)

{
  Mem *pFrom_local;
  Mem *pTo_local;
  
  sqlite3VdbeMemRelease(pTo);
  memcpy(pTo,pFrom,0x38);
  pFrom->flags = 1;
  pFrom->szMalloc = 0;
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3VdbeMemMove(Mem *pTo, Mem *pFrom){
  assert( pFrom->db==0 || sqlite3_mutex_held(pFrom->db->mutex) );
  assert( pTo->db==0 || sqlite3_mutex_held(pTo->db->mutex) );
  assert( pFrom->db==0 || pTo->db==0 || pFrom->db==pTo->db );

  sqlite3VdbeMemRelease(pTo);
  memcpy(pTo, pFrom, sizeof(Mem));
  pFrom->flags = MEM_Null;
  pFrom->szMalloc = 0;
}